

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

bool __thiscall
pybind11::detail::object_api<pybind11::handle>::contains<char_const*&>
          (object_api<pybind11::handle> *this,char **key)

{
  enable_if_t<detail::move_if_unreferenced<bool>::value,_bool> eVar1;
  object local_40;
  char *local_38;
  undefined8 local_30;
  char *local_28;
  object local_20;
  
  local_30 = *(undefined8 *)this;
  local_28 = "__contains__";
  local_20.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
            ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              *)&local_40,&local_38);
  eVar1 = cast<bool>(&local_40);
  object::~object(&local_40);
  object::~object(&local_20);
  return eVar1;
}

Assistant:

bool object_api<D>::contains(T &&key) const {
    return attr("__contains__")(std::forward<T>(key)).template cast<bool>();
}